

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

Gia_Obj_t * Gia_ManAppendObj(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  uint *puVar4;
  long lVar5;
  uint uVar6;
  
  uVar6 = p->nObjs;
  if (uVar6 == p->nObjsAlloc) {
    uVar2 = uVar6 * 2;
    if (0x1fffffff < (int)(uVar6 * 2)) {
      uVar2 = 0x20000000;
    }
    if (uVar6 == 0x20000000) {
      puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
      exit(1);
    }
    if ((int)uVar2 <= (int)uVar6) {
      __assert_fail("p->nObjs < nObjNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x288,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p->fVerbose != 0) {
      printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar6,(ulong)uVar2);
      uVar6 = p->nObjsAlloc;
    }
    if ((int)uVar6 < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x28b,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    lVar5 = (long)(int)uVar2;
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      pGVar3 = (Gia_Obj_t *)malloc(lVar5 * 0xc);
    }
    else {
      pGVar3 = (Gia_Obj_t *)realloc(p->pObjs,lVar5 * 0xc);
      uVar6 = p->nObjsAlloc;
    }
    p->pObjs = pGVar3;
    memset(pGVar3 + (int)uVar6,0,(long)(int)(uVar2 - uVar6) * 0xc);
    if (p->pMuxes != (uint *)0x0) {
      puVar4 = (uint *)realloc(p->pMuxes,lVar5 * 4);
      p->pMuxes = puVar4;
      memset(puVar4 + p->nObjsAlloc,0,(lVar5 - p->nObjsAlloc) * 4);
    }
    p->nObjsAlloc = uVar2;
  }
  if ((p->vHTable).nSize != 0) {
    Vec_IntPush(&p->vHash,0);
  }
  iVar1 = p->nObjs;
  p->nObjs = iVar1 + 1;
  if (-1 < (long)iVar1) {
    return p->pObjs + iVar1;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

static inline Gia_Obj_t * Gia_ManAppendObj( Gia_Man_t * p )  
{ 
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjNew = Abc_MinInt( 2 * p->nObjsAlloc, (1 << 29) );
        if ( p->nObjs == (1 << 29) )
            printf( "Hard limit on the number of nodes (2^29) is reached. Quitting...\n" ), exit(1);
        assert( p->nObjs < nObjNew );
        if ( p->fVerbose )
            printf("Extending GIA object storage: %d -> %d.\n", p->nObjsAlloc, nObjNew );
        assert( p->nObjsAlloc > 0 );
        p->pObjs = ABC_REALLOC( Gia_Obj_t, p->pObjs, nObjNew );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Gia_Obj_t) * (nObjNew - p->nObjsAlloc) );
        if ( p->pMuxes )
        {
            p->pMuxes = ABC_REALLOC( unsigned, p->pMuxes, nObjNew );
            memset( p->pMuxes + p->nObjsAlloc, 0, sizeof(unsigned) * (nObjNew - p->nObjsAlloc) );
        }
        p->nObjsAlloc = nObjNew;
    }
    if ( Vec_IntSize(&p->vHTable) ) Vec_IntPush( &p->vHash, 0 );
    return Gia_ManObj( p, p->nObjs++ );
}